

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printShortStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  double extraout_XMM0_Qa;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nStack_78;
  
  printStatus(this,os,this->_status);
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 4;
  std::operator<<(os,"Solving time (sec)  : ");
  (*this->_statistics->solvingTime->_vptr_Timer[6])();
  poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Iterations          : ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->_statistics->iterations);
  std::operator<<(poVar2,"\n");
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 0x100;
  poVar2 = std::operator<<(os,"Objective value     : ");
  objValueReal(&nStack_78,this);
  poVar2 = boost::multiprecision::operator<<(poVar2,&nStack_78);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void SoPlexBase<R>::printShortStatistics(std::ostream& os)
{
   printStatus(os, _status);
   SPxOut::setFixed(os, 2);
   os << "Solving time (sec)  : " << this->_statistics->solvingTime->time() << "\n"
      << "Iterations          : " << this->_statistics->iterations << "\n";
   SPxOut::setScientific(os);
   os << "Objective value     : " << objValueReal() << "\n";
}